

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

void __thiscall
spirv_cross::Compiler::register_global_read_dependencies
          (Compiler *this,SPIRBlock *block,uint32_t id)

{
  uint16_t uVar1;
  undefined8 in_RAX;
  uint32_t *puVar2;
  SPIRFunction *func;
  SPIRVariable *pSVar3;
  SPIRType *pSVar4;
  long lVar5;
  Instruction *i;
  Instruction *instr;
  undefined8 uStack_38;
  
  instr = (block->ops).super_VectorView<spirv_cross::Instruction>.ptr;
  uStack_38 = in_RAX;
  for (lVar5 = (block->ops).super_VectorView<spirv_cross::Instruction>.buffer_size * 0xc; lVar5 != 0
      ; lVar5 = lVar5 + -0xc) {
    puVar2 = stream(this,instr);
    uVar1 = instr->op;
    if (((uVar1 == 0x1169) || (uVar1 == 0x3d)) || (uVar1 == 0x62)) {
      pSVar3 = maybe_get_backing_variable(this,puVar2[2]);
      if ((pSVar3 != (SPIRVariable *)0x0) && (pSVar3->storage != Function)) {
        pSVar4 = get<spirv_cross::SPIRType>(this,*(uint32_t *)&(pSVar3->super_IVariant).field_0xc);
        if ((pSVar4->basetype != Image) && ((pSVar4->image).dim != DimSubpassData)) {
          uStack_38 = CONCAT44(id,(undefined4)uStack_38);
          SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL>::push_back
                    (&pSVar3->dependees,(TypedID<(spirv_cross::Types)0> *)((long)&uStack_38 + 4));
        }
      }
    }
    else if (uVar1 == 0x39) {
      func = get<spirv_cross::SPIRFunction>(this,puVar2[2]);
      register_global_read_dependencies(this,func,id);
    }
    instr = instr + 1;
  }
  return;
}

Assistant:

void Compiler::register_global_read_dependencies(const SPIRBlock &block, uint32_t id)
{
	for (auto &i : block.ops)
	{
		auto ops = stream(i);
		auto op = static_cast<Op>(i.op);

		switch (op)
		{
		case OpFunctionCall:
		{
			uint32_t func = ops[2];
			register_global_read_dependencies(get<SPIRFunction>(func), id);
			break;
		}

		case OpLoad:
		case OpCooperativeMatrixLoadKHR:
		case OpImageRead:
		{
			// If we're in a storage class which does not get invalidated, adding dependencies here is no big deal.
			auto *var = maybe_get_backing_variable(ops[2]);
			if (var && var->storage != StorageClassFunction)
			{
				auto &type = get<SPIRType>(var->basetype);

				// InputTargets are immutable.
				if (type.basetype != SPIRType::Image && type.image.dim != DimSubpassData)
					var->dependees.push_back(id);
			}
			break;
		}

		default:
			break;
		}
	}
}